

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O1

void test_qclab_dense_kron<double>(void)

{
  long lVar1;
  size_type *psVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  pointer *__ptr_3;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  double *pdVar10;
  long lVar11;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  SquareMatrix<double> A;
  SquareMatrix<double> B;
  SquareMatrix<double> BoA;
  SquareMatrix<double> AoB;
  SquareMatrix<double> XoI;
  AssertionResult gtest_ar__3;
  SquareMatrix<double> IoX;
  SquareMatrix<double> X;
  SquareMatrix<double> I;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Head_base<0UL,_double_*,_false> local_e0;
  SquareMatrix<double> local_d8;
  string local_c8;
  internal local_a8;
  undefined7 uStack_a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  internal local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  SquareMatrix<double> local_50;
  SquareMatrix<double> local_40;
  
  local_40.size_ = 2;
  local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined8 *)
   local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0x3ff0000000000000;
  local_50.size_ = 2;
  local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined8 *)
   local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0;
  qclab::dense::kron<double>((dense *)&local_60,&local_40,&local_50);
  pdVar4 = (double *)operator_new__(0x80);
  local_88 = (internal)0x0;
  *pdVar4 = 0.0;
  pdVar4[1] = 1.0;
  pdVar4[2] = 0.0;
  pdVar4[3] = 0.0;
  pdVar4[4] = 1.0;
  pdVar4[5] = 0.0;
  pdVar4[6] = 0.0;
  pdVar4[7] = 0.0;
  pdVar4[8] = 0.0;
  pdVar4[9] = 0.0;
  pdVar4[10] = 0.0;
  pdVar4[0xb] = 1.0;
  pdVar4[0xc] = 0.0;
  pdVar4[0xd] = 0.0;
  pdVar4[0xe] = 1.0;
  pdVar4[0xf] = 0.0;
  if (local_60 == 4) {
    if ((*pdVar4 != (double)(local_58->_M_dataplus)._M_p) ||
       (NAN(*pdVar4) || NAN((double)(local_58->_M_dataplus)._M_p))) {
      local_88 = (internal)0x0;
    }
    else {
      lVar9 = 0;
      local_88 = (internal)0x0;
      in_R9 = local_58;
      pdVar5 = pdVar4;
      while( true ) {
        lVar11 = 0;
        do {
          if (lVar11 == 3) goto LAB_00198772;
          lVar3 = lVar11 + 1;
          lVar1 = lVar11 + 1;
          psVar2 = &in_R9->_M_string_length + lVar11;
        } while ((pdVar5[lVar3] == (double)*psVar2) &&
                (lVar11 = lVar1, !NAN(pdVar5[lVar3]) && !NAN((double)*psVar2)));
        if (lVar1 < 4) break;
LAB_00198772:
        lVar9 = lVar9 + 1;
        local_88 = (internal)(3 < lVar9);
        if (lVar9 == 4) break;
        pdVar5 = pdVar5 + 4;
        in_R9 = in_R9 + 1;
        if ((pdVar4[lVar9 * 4] != (double)local_58[lVar9]._M_dataplus._M_p) ||
           (NAN(pdVar4[lVar9 * 4]) || NAN((double)local_58[lVar9]._M_dataplus._M_p))) break;
      }
    }
  }
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_88) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_88,(AssertionResult *)"IoX == IoX_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  qclab::dense::kron<double>((dense *)&local_88,&local_50,&local_40);
  pdVar5 = (double *)operator_new__(0x80);
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  pdVar5[2] = 1.0;
  pdVar5[3] = 0.0;
  pdVar5[4] = 0.0;
  pdVar5[5] = 0.0;
  pdVar5[6] = 0.0;
  pdVar5[7] = 1.0;
  pdVar5[8] = 1.0;
  pdVar5[9] = 0.0;
  pdVar5[10] = 0.0;
  pdVar5[0xb] = 0.0;
  pdVar5[0xc] = 0.0;
  pdVar5[0xd] = 1.0;
  pdVar5[0xe] = 0.0;
  pdVar5[0xf] = 0.0;
  if (CONCAT71(uStack_87,local_88) == 4) {
    if ((*pdVar5 != (double)(local_80->_M_dataplus)._M_p) ||
       (NAN(*pdVar5) || NAN((double)(local_80->_M_dataplus)._M_p))) goto LAB_00198180;
    lVar9 = 0;
    bVar8 = false;
    in_R9 = local_80;
    pdVar6 = pdVar5;
    while( true ) {
      lVar11 = 0;
      do {
        if (lVar11 == 3) goto LAB_001987f0;
        lVar3 = lVar11 + 1;
        lVar1 = lVar11 + 1;
        psVar2 = &in_R9->_M_string_length + lVar11;
      } while ((pdVar6[lVar3] == (double)*psVar2) &&
              (lVar11 = lVar1, !NAN(pdVar6[lVar3]) && !NAN((double)*psVar2)));
      if (lVar1 < 4) break;
LAB_001987f0:
      lVar9 = lVar9 + 1;
      bVar8 = 3 < lVar9;
      if (lVar9 == 4) break;
      pdVar6 = pdVar6 + 4;
      in_R9 = in_R9 + 1;
      if ((pdVar5[lVar9 * 4] != (double)local_80[lVar9]._M_dataplus._M_p) ||
         (NAN(pdVar5[lVar9 * 4]) || NAN((double)local_80[lVar9]._M_dataplus._M_p))) break;
    }
  }
  else {
LAB_00198180:
    bVar8 = false;
  }
  local_e8[0] = bVar8;
  local_e0._M_head_impl = (double *)0x0;
  if (bVar8 == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_e8,(AssertionResult *)"XoI == XoI_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_d8.size_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8.size_ + 8))();
    }
  }
  if (local_e0._M_head_impl != (double *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl);
  }
  local_e8 = (undefined1  [8])0x2;
  local_e0._M_head_impl = (double *)operator_new__(0x20);
  *local_e0._M_head_impl = 1.0;
  *(undefined1 **)((long)local_e0._M_head_impl + 8) = &DAT_4008000000000000;
  *(undefined8 *)((long)local_e0._M_head_impl + 0x10) = 0x4000000000000000;
  *(undefined1 **)((long)local_e0._M_head_impl + 0x18) = &DAT_4014000000000000;
  local_d8.size_ = 2;
  local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined1 **)
   local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = &DAT_401c000000000000;
  *(undefined1 **)
   ((long)local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = &DAT_402a000000000000;
  *(undefined1 **)
   ((long)local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = &DAT_4026000000000000;
  *(undefined8 *)
   ((long)local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0x4031000000000000;
  qclab::dense::kron<double>((dense *)&local_98,(SquareMatrix<double> *)local_e8,&local_d8);
  pdVar6 = (double *)operator_new__(0x80);
  *pdVar6 = (double)&DAT_401c000000000000;
  pdVar6[1] = (double)&DAT_402a000000000000;
  pdVar6[2] = 21.0;
  pdVar6[3] = 39.0;
  pdVar6[4] = (double)&DAT_4026000000000000;
  pdVar6[5] = 17.0;
  pdVar6[6] = 33.0;
  pdVar6[7] = 51.0;
  pdVar6[8] = (double)&DAT_402c000000000000;
  pdVar6[9] = 26.0;
  pdVar6[10] = 35.0;
  pdVar6[0xb] = 65.0;
  pdVar6[0xc] = 22.0;
  pdVar6[0xd] = 34.0;
  pdVar6[0xe] = 55.0;
  pdVar6[0xf] = 85.0;
  if (local_98.data_ == (AssertHelperData *)&DAT_00000004) {
    if ((*pdVar6 != (double)(local_90->_M_dataplus)._M_p) ||
       (NAN(*pdVar6) || NAN((double)(local_90->_M_dataplus)._M_p))) goto LAB_001983d5;
    lVar9 = 0;
    local_a8 = (internal)0x0;
    in_R9 = local_90;
    pdVar7 = pdVar6;
    while( true ) {
      lVar11 = 0;
      do {
        if (lVar11 == 3) goto LAB_0019886e;
        lVar3 = lVar11 + 1;
        lVar1 = lVar11 + 1;
        psVar2 = &in_R9->_M_string_length + lVar11;
      } while ((pdVar7[lVar3] == (double)*psVar2) &&
              (lVar11 = lVar1, !NAN(pdVar7[lVar3]) && !NAN((double)*psVar2)));
      if (lVar1 < 4) break;
LAB_0019886e:
      lVar9 = lVar9 + 1;
      local_a8 = (internal)(3 < lVar9);
      if (lVar9 == 4) break;
      pdVar7 = pdVar7 + 4;
      in_R9 = in_R9 + 1;
      if ((pdVar6[lVar9 * 4] != (double)local_90[lVar9]._M_dataplus._M_p) ||
         (NAN(pdVar6[lVar9 * 4]) || NAN((double)local_90[lVar9]._M_dataplus._M_p))) break;
    }
  }
  else {
LAB_001983d5:
    local_a8 = (internal)0x0;
  }
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8 == (internal)0x0) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,&local_a8,(AssertionResult *)"AoB == AoB_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  qclab::dense::kron<double>((dense *)&local_a8,&local_d8,(SquareMatrix<double> *)local_e8);
  pdVar7 = (double *)operator_new__(0x80);
  *pdVar7 = (double)&DAT_401c000000000000;
  pdVar7[1] = 21.0;
  pdVar7[2] = (double)&DAT_402a000000000000;
  pdVar7[3] = 39.0;
  pdVar7[4] = (double)&DAT_402c000000000000;
  pdVar7[5] = 35.0;
  pdVar7[6] = 26.0;
  pdVar7[7] = 65.0;
  pdVar7[8] = (double)&DAT_4026000000000000;
  pdVar7[9] = 33.0;
  pdVar7[10] = 17.0;
  pdVar7[0xb] = 51.0;
  pdVar7[0xc] = 22.0;
  pdVar7[0xd] = 55.0;
  pdVar7[0xe] = 34.0;
  pdVar7[0xf] = 85.0;
  if (CONCAT71(uStack_a7,local_a8) == 4) {
    if ((*pdVar7 == (double)(local_a0->_M_dataplus)._M_p) &&
       (!NAN(*pdVar7) && !NAN((double)(local_a0->_M_dataplus)._M_p))) {
      lVar9 = 0;
      local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)0x0;
      in_R9 = local_a0;
      pdVar10 = pdVar7;
      while( true ) {
        lVar11 = 0;
        do {
          if (lVar11 == 3) goto LAB_001988ec;
          lVar3 = lVar11 + 1;
          lVar1 = lVar11 + 1;
          psVar2 = &in_R9->_M_string_length + lVar11;
        } while ((pdVar10[lVar3] == (double)*psVar2) &&
                (lVar11 = lVar1, !NAN(pdVar10[lVar3]) && !NAN((double)*psVar2)));
        if (lVar1 < 4) break;
LAB_001988ec:
        lVar9 = lVar9 + 1;
        local_78.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)(3 < lVar9);
        if (lVar9 == 4) break;
        pdVar10 = pdVar10 + 4;
        in_R9 = in_R9 + 1;
        if ((pdVar7[lVar9 * 4] != (double)local_a0[lVar9]._M_dataplus._M_p) ||
           (NAN(pdVar7[lVar9 * 4]) || NAN((double)local_a0[lVar9]._M_dataplus._M_p))) break;
      }
      goto LAB_001985af;
    }
  }
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)0x0;
LAB_001985af:
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&local_78,(AssertionResult *)"BoA == BoA_check","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  operator_delete__(pdVar7);
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a0);
  }
  operator_delete__(pdVar6);
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_90);
  }
  if (local_d8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)local_e0._M_head_impl !=
      (double *)0x0) {
    operator_delete__(local_e0._M_head_impl);
  }
  operator_delete__(pdVar5);
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_80);
  }
  operator_delete__(pdVar4);
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_58);
  }
  if (local_50.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_50.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_40.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_40.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}